

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool (anonymous_namespace)::
     TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmEnumPathSegmentsGenerator&,(anonymous_namespace)::cmAppendPathSegmentGenerator&,(anonymous_namespace)::cmProjectDirectoryListGenerator&>
               (anon_class_8_1_8991fb9c *filesCollector,string *startPath,
               cmEnumPathSegmentsGenerator *gen,cmAppendPathSegmentGenerator *tail,
               cmProjectDirectoryListGenerator *tail_1)

{
  byte bVar1;
  bool bVar2;
  string local_90;
  int local_5c;
  undefined1 local_58 [8];
  string path;
  cmProjectDirectoryListGenerator *tail_local_1;
  cmAppendPathSegmentGenerator *tail_local;
  cmEnumPathSegmentsGenerator *gen_local;
  string *startPath_local;
  anon_class_8_1_8991fb9c *filesCollector_local;
  
  path.field_2._8_8_ = tail_1;
  ResetGenerator<(anonymous_namespace)::cmEnumPathSegmentsGenerator&>(gen);
  anon_unknown.dwarf_c5b91d::cmEnumPathSegmentsGenerator::GetNextCandidate
            ((string *)local_58,gen,startPath);
  do {
    bVar1 = std::__cxx11::string::empty();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      local_5c = 2;
LAB_006b25b9:
      std::__cxx11::string::~string((string *)local_58);
      if (local_5c != 1) {
        filesCollector_local._7_1_ = 0;
      }
      return (bool)(filesCollector_local._7_1_ & 1);
    }
    ResetGenerator<(anonymous_namespace)::cmAppendPathSegmentGenerator&,(anonymous_namespace)::cmProjectDirectoryListGenerator&>
              (tail,(cmProjectDirectoryListGenerator *)path.field_2._8_8_);
    bVar2 = TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmAppendPathSegmentGenerator&,(anonymous_namespace)::cmProjectDirectoryListGenerator&>
                      (filesCollector,(string *)local_58,tail,
                       (cmProjectDirectoryListGenerator *)path.field_2._8_8_);
    if (bVar2) {
      filesCollector_local._7_1_ = 1;
      local_5c = 1;
      goto LAB_006b25b9;
    }
    anon_unknown.dwarf_c5b91d::cmEnumPathSegmentsGenerator::GetNextCandidate
              (&local_90,gen,startPath);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  } while( true );
}

Assistant:

bool TryGeneratedPaths(CallbackFn&& filesCollector,
                       const std::string& startPath, Generator&& gen,
                       Rest&&... tail)
{
  ResetGenerator(std::forward<Generator&&>(gen));
  for (auto path = gen.GetNextCandidate(startPath); !path.empty();
       path = gen.GetNextCandidate(startPath)) {
    ResetGenerator(std::forward<Rest&&>(tail)...);
    if (TryGeneratedPaths(std::forward<CallbackFn&&>(filesCollector), path,
                          std::forward<Rest&&>(tail)...)) {
      return true;
    }
  }
  return false;
}